

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_host.c
# Opt level: O0

void test_distributed_fft_3d_compare(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  void *pvVar5;
  void *pvVar6;
  int iVar7;
  long lVar8;
  undefined8 *puVar9;
  int **ppiVar10;
  byte bVar11;
  float fVar12;
  float fVar13;
  double im_kiss;
  double re_kiss;
  double im;
  double re;
  int n_wave_local;
  dfft_plan plan;
  cpx_t *out;
  int z_local;
  int y_local;
  int x_local;
  cpx_t *in;
  kiss_fftnd_cfg cfg;
  kiss_fft_cpx *out_kiss;
  int nz;
  int ny;
  int nx;
  int z;
  int y;
  int x;
  double abs_tol;
  double tol;
  float sig_digits;
  float scale;
  kiss_fft_cpx *in_kiss;
  int local_nz;
  int local_ny;
  int local_nx;
  int *dim_glob;
  int idx;
  int pidx [3];
  int i;
  int ptot;
  int root;
  int r;
  int *pdim;
  int nd;
  int p;
  int s;
  int *local_368;
  undefined4 local_360;
  undefined4 local_358;
  undefined4 in_stack_fffffffffffffcb0;
  undefined4 in_stack_fffffffffffffcb4;
  kiss_fft_cpx *in_stack_fffffffffffffcb8;
  kiss_fftnd_cfg in_stack_fffffffffffffcc0;
  void *in_stack_fffffffffffffcc8;
  int in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  int *in_stack_fffffffffffffcd8;
  int local_214;
  undefined8 local_1e8 [38];
  void *local_b8;
  int local_ac;
  int local_a8;
  int local_a4;
  void *local_a0;
  kiss_fftnd_cfg local_98;
  void *local_90;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  double local_70;
  double local_68;
  float local_60;
  float local_5c;
  void *local_58;
  int local_4c;
  int local_48;
  int local_44;
  int *local_40;
  int local_38;
  int local_34 [7];
  int *local_18;
  int local_c;
  int local_8;
  int local_4;
  
  bVar11 = 0;
  MPI_Comm_size(&ompi_mpi_comm_world,&local_8);
  MPI_Comm_rank(&ompi_mpi_comm_world,&local_4);
  local_c = 3;
  local_18 = (int *)malloc(0xc);
  fVar12 = powf((float)local_8,1.0 / (float)local_c);
  local_34[6] = (int)(fVar12 + 0.5);
  for (local_34[5] = 1; local_34[5] < local_34[6]; local_34[5] = local_34[5] << 1) {
  }
  local_34[4] = 1;
  if (local_4 == 0) {
    printf("Processor grid: ");
  }
  for (local_34[3] = 0; local_34[3] < local_c + -1; local_34[3] = local_34[3] + 1) {
    if (local_8 < local_34[4] * local_34[5]) {
      local_214 = 1;
    }
    else {
      local_214 = local_34[5];
    }
    local_18[local_34[3]] = local_214;
    local_34[4] = local_18[local_34[3]] * local_34[4];
    if (local_4 == 0) {
      printf("%d x ",(ulong)(uint)local_18[local_34[3]]);
    }
  }
  local_18[local_c + -1] = local_8 / local_34[4];
  if (local_4 == 0) {
    printf("%d\n",(ulong)(uint)local_18[local_c + -1]);
  }
  local_38 = local_4;
  for (local_34[3] = 2; -1 < local_34[3]; local_34[3] = local_34[3] + -1) {
    local_34[local_34[3]] = local_38 % local_18[local_34[3]];
    local_38 = local_38 / local_18[local_34[3]];
  }
  local_40 = (int *)malloc((long)local_c << 2);
  local_44 = 4;
  local_48 = 8;
  local_4c = 0x10;
  *local_40 = *local_18 * 4;
  local_40[1] = local_18[1] * 8;
  local_40[2] = local_18[2] * 0x10;
  for (local_34[3] = 0; local_34[3] < local_c + -1; local_34[3] = local_34[3] + 1) {
    if (local_4 == 0) {
      printf("%d x ",(ulong)(uint)local_40[local_34[3]]);
    }
  }
  if (local_4 == 0) {
    printf("%d matrix\n",(ulong)(uint)local_40[local_c + -1]);
  }
  local_58 = malloc((long)*local_40 * 8 * (long)local_40[1] * (long)local_40[2]);
  srand(0x3039);
  local_5c = (float)(*local_40 * local_40[1] * local_40[2]);
  fVar12 = logf(local_5c);
  fVar13 = logf(2.0);
  local_60 = 7.0 - (fVar12 * 0.5) / fVar13;
  fVar12 = powf(10.0,-local_60);
  local_68 = (double)fVar12;
  local_70 = local_68 * 1.0;
  printf("Testing with %f sig digits, rel precision %f, abs precision %f\n",
         SUB84((double)local_60,0),local_68,local_70);
  local_80 = *local_40;
  local_84 = local_40[1];
  local_88 = local_40[2];
  for (local_74 = 0; local_74 < *local_40; local_74 = local_74 + 1) {
    for (local_78 = 0; local_78 < local_40[1]; local_78 = local_78 + 1) {
      for (local_7c = 0; local_7c < local_40[2]; local_7c = local_7c + 1) {
        iVar7 = rand();
        *(float *)((long)local_58 +
                  (long)(local_7c + local_88 * (local_78 + local_84 * local_74)) * 8) =
             (float)iVar7 / 2.1474836e+09;
        iVar7 = rand();
        *(float *)((long)local_58 +
                  (long)(local_7c + local_88 * (local_78 + local_84 * local_74)) * 8 + 4) =
             (float)iVar7 / 2.1474836e+09;
      }
    }
  }
  local_90 = malloc((long)*local_40 * 8 * (long)local_40[1] * (long)local_40[2]);
  local_98 = kiss_fftnd_alloc(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
                              in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                              (size_t *)in_stack_fffffffffffffcc0);
  kiss_fftnd(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,
             (kiss_fft_cpx *)CONCAT44(in_stack_fffffffffffffcb4,in_stack_fffffffffffffcb0));
  local_a0 = malloc((long)local_44 * 8 * (long)local_48 * (long)local_4c);
  for (local_74 = 0; local_74 < local_80; local_74 = local_74 + 1) {
    for (local_78 = 0; local_78 < local_84; local_78 = local_78 + 1) {
      for (local_7c = 0; local_7c < local_88; local_7c = local_7c + 1) {
        if (((((local_34[0] * local_44 <= local_74) && (local_74 < (local_34[0] + 1) * local_44)) &&
             (local_34[1] * local_48 <= local_78)) &&
            ((local_78 < (local_34[1] + 1) * local_48 && (local_34[2] * local_4c <= local_7c)))) &&
           (local_7c < (local_34[2] + 1) * local_4c)) {
          local_a4 = local_74 - local_34[0] * local_44;
          local_a8 = local_78 - local_34[1] * local_48;
          local_ac = local_7c - local_34[2] * local_4c;
          *(undefined4 *)
           ((long)local_a0 + (long)(local_ac + local_4c * (local_a8 + local_48 * local_a4)) * 8) =
               *(undefined4 *)
                ((long)local_58 + (long)(local_7c + local_88 * (local_78 + local_84 * local_74)) * 8
                );
          *(undefined4 *)
           ((long)local_a0 + (long)(local_ac + local_4c * (local_a8 + local_48 * local_a4)) * 8 + 4)
               = *(undefined4 *)
                  ((long)local_58 +
                  (long)(local_7c + local_88 * (local_78 + local_84 * local_74)) * 8 + 4);
        }
      }
    }
  }
  local_b8 = malloc((long)(local_44 * local_48 * local_4c) << 3);
  local_368 = local_34;
  local_360 = 0;
  local_358 = 0;
  dfft_create_plan(local_1e8,3,local_40,0,0,local_18);
  pvVar6 = local_a0;
  pvVar5 = local_b8;
  puVar9 = local_1e8;
  ppiVar10 = &local_368;
  for (lVar8 = 0x26; lVar8 != 0; lVar8 = lVar8 + -1) {
    *ppiVar10 = (int *)*puVar9;
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    ppiVar10 = ppiVar10 + (ulong)bVar11 * -2 + 1;
  }
  dfft_execute(pvVar6,pvVar5,0);
  local_34[3] = 0;
  do {
    if (local_44 * local_48 * local_4c <= local_34[3]) {
      free(local_58);
      free(local_90);
      free(local_b8);
      free(local_a0);
      free(local_40);
      puVar9 = local_1e8;
      ppiVar10 = &local_368;
      for (lVar8 = 0x26; lVar8 != 0; lVar8 = lVar8 + -1) {
        *ppiVar10 = (int *)*puVar9;
        puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
        ppiVar10 = ppiVar10 + (ulong)bVar11 * -2 + 1;
      }
      dfft_destroy_plan();
      return;
    }
    local_a4 = (int)((long)((ulong)(uint)((int)((long)local_34[3] / (long)local_48) >> 0x1f) << 0x20
                           | (long)local_34[3] / (long)local_48 & 0xffffffffU) / (long)local_4c);
    local_a8 = (local_34[3] - local_a4 * local_48 * local_4c) / local_4c;
    local_ac = local_34[3] % local_4c;
    local_74 = local_34[0] * local_44 + local_a4;
    local_78 = local_34[1] * local_48 + local_a8;
    local_7c = local_34[2] * local_4c + local_ac;
    dVar1 = (double)*(float *)((long)local_b8 + (long)local_34[3] * 8);
    dVar2 = (double)*(float *)((long)local_b8 + (long)local_34[3] * 8 + 4);
    dVar3 = (double)*(float *)((long)local_90 +
                              (long)(local_7c + local_88 * (local_78 + local_84 * local_74)) * 8);
    dVar4 = (double)*(float *)((long)local_90 +
                              (long)(local_7c + local_88 * (local_78 + local_84 * local_74)) * 8 + 4
                              );
    if (local_70 <= ABS(dVar3)) {
      if ((((dVar1 < 0.0) || (dVar1 * (local_68 + 1.0) < dVar3)) ||
          (dVar3 < dVar1 * (1.0 - local_68))) &&
         (((0.0 <= dVar1 || (dVar3 < dVar1 * (local_68 + 1.0))) ||
          (dVar1 * (1.0 - local_68) < dVar3)))) {
        printf("Test failed at line %d! %f != %f (rel tol: %f)\n",SUB84(dVar1,0),dVar3,local_68,
               0x239);
        exit(1);
      }
    }
    else if (local_70 * 2.0 < ABS(dVar1)) {
      printf("Test failed at line %d! abs(%f) >= %f \n",SUB84(dVar1,0),local_70 * 2.0,0x235);
      exit(1);
    }
    if (local_70 <= ABS(dVar4)) {
      if ((((dVar2 < 0.0) || (dVar2 * (local_68 + 1.0) < dVar4)) ||
          (dVar4 < dVar2 * (1.0 - local_68))) &&
         (((0.0 <= dVar2 || (dVar4 < dVar2 * (local_68 + 1.0))) ||
          (dVar2 * (1.0 - local_68) < dVar4)))) {
        printf("Test failed at line %d! %f != %f (rel tol: %f)\n",SUB84(dVar2,0),dVar4,local_68,
               0x242);
        exit(1);
      }
    }
    else if (local_70 * 2.0 < ABS(dVar2)) {
      printf("Test failed at line %d! abs(%f) >= %f \n",SUB84(dVar2,0),local_70 * 2.0,0x23e);
      exit(1);
    }
    local_34[3] = local_34[3] + 1;
  } while( true );
}

Assistant:

void test_distributed_fft_3d_compare()
    {
    int s,p;
    MPI_Comm_size(MPI_COMM_WORLD, &p);
    MPI_Comm_rank(MPI_COMM_WORLD, &s);

    int nd = 3;
    int *pdim;
    pdim = (int *) malloc(sizeof(int)*nd);
    /* choose a decomposition */
    int r = powf(p,1.0/(double)nd)+0.5;
    int root = 1;
    while (root < r) root*=2;
    int ptot = 1;
    if (!s) printf("Processor grid: ");
    int i;
    for (i = 0; i < nd-1; ++i)
        {
        pdim[i] = (((ptot*root) > p) ? 1 : root);
        ptot *= pdim[i];
        if (!s) printf("%d x ",pdim[i]);
        }
    pdim[nd-1] = p/ptot;
    if (!s) printf("%d\n", pdim[nd-1]);

    /* determine processor index */
    int pidx[3];
    int idx = s;
    for (i = 2; i >= 0; --i)
        {
        pidx[i] = idx % pdim[i];
        idx /= pdim[i];
        }

    int *dim_glob;
    dim_glob = (int *) malloc(sizeof(int)*nd);

    // Do a pdim[0]*4 x pdim[1]* 8 x pdim[2] * 16 FFT (powers of two)
    int local_nx = 4;
    int local_ny = 8;
    int local_nz = 16;
    dim_glob[0] = pdim[0]*local_nx;
    dim_glob[1] = pdim[1]*local_ny;
    dim_glob[2] = pdim[2]*local_nz;

    for (i = 0; i < nd-1; ++i)
        if (!s) printf("%d x ",dim_glob[i]);
    if (!s) printf("%d matrix\n", dim_glob[nd-1]);

    kiss_fft_cpx *in_kiss;
    in_kiss = (kiss_fft_cpx *)malloc(sizeof(kiss_fft_cpx)*dim_glob[0]*dim_glob[1]*dim_glob[2]);

    srand(12345);

    float scale = dim_glob[0]*dim_glob[1]*dim_glob[2];
    /* assume 0.5 sig digit loss per addition/twiddling (empirical)*/
    float sig_digits = 7.0-0.5*logf(scale)/logf(2.0);
    double tol = powf(10.0,-sig_digits);
    double abs_tol = 1.0*tol;
    printf("Testing with %f sig digits, rel precision %f, abs precision %f\n", sig_digits,  tol, abs_tol);

    // fill table with complex random numbers in row major order
    int x,y,z;
    int nx = dim_glob[0];
    int ny = dim_glob[1];
    int nz = dim_glob[2];
    for (x = 0; x < dim_glob[0]; ++x)
        for (y = 0; y < dim_glob[1]; ++y)
            for (z = 0; z < dim_glob[2]; ++z)
                {
                // KISS has column-major storage
                in_kiss[z+nz*(y+ny*x)].r = (float)rand()/(float)RAND_MAX;
                in_kiss[z+nz*(y+ny*x)].i = (float)rand()/(float)RAND_MAX;
                }

    kiss_fft_cpx *out_kiss;
    out_kiss = (kiss_fft_cpx *)malloc(sizeof(kiss_fft_cpx)*dim_glob[0]*dim_glob[1]*dim_glob[2]);

    // construct forward transform
    kiss_fftnd_cfg cfg = kiss_fftnd_alloc(dim_glob,3,0,NULL,NULL);

    // carry out conventional FFT
    kiss_fftnd(cfg, in_kiss, out_kiss);

    // compare to distributed FFT
    cpx_t * in;
    in = (cpx_t *)malloc(sizeof(cpx_t)*local_nx*local_ny*local_nz);

    int x_local, y_local, z_local;
    for (x = 0; x < nx; ++x)
        for (y = 0; y < ny; ++y)
            for (z = 0; z < nz; ++z)
                {
                if (x>=pidx[0]*local_nx && x < (pidx[0]+1)*local_nx && 
                    y>=pidx[1]*local_ny && y < (pidx[1]+1)*local_ny &&
                    z>=pidx[2]*local_nz && z < (pidx[2]+1)*local_nz)
                    {
                    x_local = x - pidx[0]*local_nx;
                    y_local = y - pidx[1]*local_ny;
                    z_local = z - pidx[2]*local_nz;

                    RE(in[z_local+local_nz*(y_local+local_ny*x_local)]) =
                        in_kiss[z+nz*(y+ny*x)].r;
                    IM(in[z_local+local_nz*(y_local+local_ny*x_local)]) =
                        in_kiss[z+nz*(y+ny*x)].i;
                    }
                }

    cpx_t *out;
    out = (cpx_t *) malloc(local_nx*local_ny*local_nz*sizeof(cpx_t));

    dfft_plan plan;
    dfft_create_plan(&plan,3, dim_glob, NULL, NULL, pdim,pidx, 0, 0, 0, MPI_COMM_WORLD, proc_map);

    // forward transform
    dfft_execute(in, out, 0, plan);

    // do comparison
    int n_wave_local = local_nx * local_ny * local_nz;
    for (i = 0; i < n_wave_local; ++i)
        {

        x_local = i / local_ny / local_nz;
        y_local = (i - x_local*local_ny*local_nz)/local_nz;
        z_local = i % local_nz;

        x = pidx[0]*local_nx + x_local;
        y = pidx[1]*local_ny + y_local;
        z = pidx[2]*local_nz + z_local;

        double re = RE(out[i]);
        double im = IM(out[i]);
        double re_kiss = out_kiss[z+nz*(y+ny*x)].r;
        double im_kiss = out_kiss[z+nz*(y+ny*x)].i;  

        if (fabs(re_kiss) < abs_tol)
            {
            CHECK_SMALL(re,2*abs_tol);
            }
        else
            {
            CHECK_CLOSE(re,re_kiss, tol);
            }

        if (fabs(im_kiss) < abs_tol)
            {
            CHECK_SMALL(im,2*abs_tol);
            }
        else
            {
            CHECK_CLOSE(im, im_kiss, tol);
            }
        }
    free(in_kiss);
    free(out_kiss);
    free(out);
    free(in);
    free(dim_glob);
    dfft_destroy_plan(plan);
    }